

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultTimeZone
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cchUseLength;
  charcount_t cVar4;
  undefined4 *puVar5;
  Recycler *this;
  char16 *content;
  Recycler *pRVar6;
  LPCSTR message;
  JavascriptString *pJVar7;
  ScriptContext *pSVar8;
  size_t size;
  uint uVar9;
  uint in_stack_00000010;
  undefined1 local_68 [8];
  TrackAllocData data;
  int local_34 [2];
  UErrorCode status;
  
  pSVar8 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar8->threadContext,0xc00,pSVar8,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb74,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb74,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  pSVar8 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb74,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  pRVar6 = pSVar8->recycler;
  local_34[0] = 0;
  local_68 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 8;
  data.count = (size_t)anon_var_dwarf_6708ef9;
  data.filename._0_4_ = 0x159;
  this = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_68);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  content = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this,0x10);
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  cchUseLength = ucal_getDefaultTimeZone_70(content,8,local_34);
  if ((int)cchUseLength < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  if ((local_34[0] == 0xf) || (local_34[0] == -0x7c)) {
    if ((int)cchUseLength < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar2) goto LAB_00b64788;
      *puVar5 = 0;
    }
    uVar9 = cchUseLength + 1;
    data._32_8_ = pSVar8;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar9);
    local_34[0] = 0;
    local_68 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_6708ef9;
    data.filename._0_4_ = 0x162;
    data.plusSize = (long)(int)uVar9;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_68);
    if (cchUseLength == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
      content = (char16 *)&DAT_00000008;
    }
    else {
      size = 0xffffffffffffffff;
      if (-1 < (int)uVar9) {
        size = (long)(int)uVar9 * 2;
      }
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b64788;
        *puVar5 = 0;
      }
      content = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar6,size);
      if (content == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00b64788;
        *puVar5 = 0;
      }
    }
    pSVar8 = (ScriptContext *)data._32_8_;
    cVar4 = ucal_getDefaultTimeZone_70(content,uVar9,local_34);
    bVar2 = cVar4 != cchUseLength;
    cchUseLength = cVar4;
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      goto joined_r0x00b646a4;
    }
  }
  else if (7 < (int)cchUseLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b646a4:
    if (!bVar2) goto LAB_00b64788;
    *puVar5 = 0;
  }
  if (0 < local_34[0] || local_34[0] == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    message = (LPCSTR)u_errorName_70(local_34[0]);
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,message);
    if (!bVar2) {
LAB_00b64788:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pJVar7 = JavascriptString::NewWithBuffer(content,cchUseLength,pSVar8);
  return pJVar7;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultTimeZone(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        WindowsGlobalizationAdapter* wga = GetWindowsGlobalizationAdapter(scriptContext);
        DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
        AutoHSTRING str;

        HRESULT hr;
        if (FAILED(hr = wga->GetDefaultTimeZoneId(scriptContext, &str)))
        {
            HandleOOMSOEHR(hr);
            //If we can't get default timeZone, return undefined.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*str, NULL);
        return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
#else
        int timeZoneLen = 0;
        char16 *timeZone = nullptr;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return ucal_getDefaultTimeZone(buf, bufLen, status);
        }, scriptContext->GetRecycler(), &timeZone, &timeZoneLen);
        return JavascriptString::NewWithBuffer(timeZone, timeZoneLen, scriptContext);
#endif
    }